

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QAnimationTimer::stopTimer(QAnimationTimer *this)

{
  QAbstractAnimationTimer *unaff_RBX;
  bool bVar1;
  
  this[0x26] = (QAnimationTimer)0x0;
  if (this[0x25] == (QAnimationTimer)0x1) {
    bVar1 = *(long *)(this + 0x50) != 0;
  }
  else {
    bVar1 = false;
  }
  if ((!bVar1) && (*(long *)(this + 0x38) == 0)) {
    QUnifiedTimer::resumeAnimationTimer((QAbstractAnimationTimer *)0x3a1d3d);
    QUnifiedTimer::stopAnimationTimer(unaff_RBX);
    *(undefined8 *)(this + 0x18) = 0;
  }
  return;
}

Assistant:

void QAnimationTimer::stopTimer()
{
    stopTimerPending = false;
    bool pendingStart = startAnimationPending && animationsToStart.size() > 0;
    if (animations.isEmpty() && !pendingStart) {
        QUnifiedTimer::resumeAnimationTimer(this);
        QUnifiedTimer::stopAnimationTimer(this);
        // invalidate the start reference time
        lastTick = 0;
    }
}